

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

string * __thiscall FIX::SessionID::toString(SessionID *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&(this->m_beginString).super_StringField.super_FieldBase.m_string,":");
  std::operator+(&local_78,&local_38,
                 &(this->m_senderCompID).super_StringField.super_FieldBase.m_string);
  std::operator+(&local_58,&local_78,"->");
  std::operator+(&bStack_98,&local_58,
                 &(this->m_targetCompID).super_StringField.super_FieldBase.m_string);
  std::__cxx11::string::operator=((string *)str,(string *)&bStack_98);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  if ((this->m_sessionQualifier)._M_string_length != 0) {
    std::operator+(&bStack_98,":",&this->m_sessionQualifier);
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::~string((string *)&bStack_98);
  }
  return str;
}

Assistant:

std::string& toString( std::string& str ) const
  {
    str = getBeginString().getValue() + ":" +
          getSenderCompID().getValue() + "->" +
          getTargetCompID().getValue();
    if( m_sessionQualifier.size() )
      str += ":" + m_sessionQualifier;
    return str;
  }